

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O1

QString * includeGuard(QString *__return_storage_ptr__,QString *filename)

{
  char16_t cVar1;
  Data *pDVar2;
  bool bVar3;
  ulong alloc;
  ulong uVar4;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUpper_helper(__return_storage_ptr__,filename);
  alloc = (__return_storage_ptr__->d).size;
  if (alloc != 0) {
    uVar4 = 0;
    do {
      cVar1 = (__return_storage_ptr__->d).ptr[uVar4];
      if ((9 < (ushort)cVar1 - 0x30) &&
         (0x39 < (ushort)cVar1 - 0x41 || 0xfffffff9 < (ushort)cVar1 - 0x61)) {
        if (0x7f < (ushort)cVar1) {
          bVar3 = QChar::isLetterOrNumber_helper((uint)(ushort)cVar1);
          if (bVar3) goto LAB_0010aa53;
        }
        pDVar2 = (__return_storage_ptr__->d).d;
        if ((pDVar2 == (Data *)0x0) ||
           (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
        }
        (__return_storage_ptr__->d).ptr[uVar4] = L'_';
      }
LAB_0010aa53:
      uVar4 = uVar4 + 1;
      alloc = (__return_storage_ptr__->d).size;
    } while (uVar4 < alloc);
  }
  return __return_storage_ptr__;
}

Assistant:

QString includeGuard(const QString &filename)
{
    QString guard = filename.toUpper();

    for (int i = 0; i < guard.size(); ++i) {
        if (!guard.at(i).isLetterOrNumber())
            guard[i] = u'_';
    }

    return guard;
}